

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O0

lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
* __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::get_token_string(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                   *this)

{
  bool bVar1;
  reference pcVar2;
  ostream *poVar3;
  undefined8 uVar4;
  void *this_00;
  long in_RSI;
  string local_200 [39];
  char local_1d9;
  int local_1d8;
  stringstream local_1c8 [8];
  stringstream ss;
  ostream local_1b8 [383];
  char local_39;
  const_iterator cStack_38;
  char c;
  const_iterator __end3;
  const_iterator __begin3;
  vector<char,_std::allocator<char>_> *__range3;
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)this);
  __end3 = std::vector<char,_std::allocator<char>_>::begin
                     ((vector<char,_std::allocator<char>_> *)(in_RSI + 0x20));
  cStack_38 = std::vector<char,_std::allocator<char>_>::end
                        ((vector<char,_std::allocator<char>_> *)(in_RSI + 0x20));
  while (bVar1 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffffc8), bVar1) {
    pcVar2 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&__end3);
    local_39 = *pcVar2;
    if ((local_39 < '\0') || ('\x1f' < local_39)) {
      std::__cxx11::string::push_back((char)this);
    }
    else {
      std::__cxx11::stringstream::stringstream(local_1c8);
      poVar3 = std::operator<<(local_1b8,"<U+");
      local_1d8 = (int)std::setw(4);
      poVar3 = std::operator<<(poVar3,(_Setw)local_1d8);
      uVar4 = std::ostream::operator<<(poVar3,std::uppercase);
      local_1d9 = (char)std::setfill<char>('0');
      poVar3 = std::operator<<(uVar4,local_1d9);
      this_00 = (void *)std::ostream::operator<<(poVar3,std::hex);
      poVar3 = (ostream *)std::ostream::operator<<(this_00,(int)local_39);
      std::operator<<(poVar3,">");
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator+=((string *)this,local_200);
      std::__cxx11::string::~string(local_200);
      std::__cxx11::stringstream::~stringstream(local_1c8);
    }
    __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
    operator++(&__end3);
  }
  return this;
}

Assistant:

std::string get_token_string() const
    {
        // escape control characters
        std::string result;
        for (const auto c : token_string)
        {
            if ('\x00' <= c and c <= '\x1F')
            {
                // escape control characters
                std::stringstream ss;
                ss << "<U+" << std::setw(4) << std::uppercase << std::setfill('0')
                   << std::hex << static_cast<int>(c) << ">";
                result += ss.str();
            }
            else
            {
                // add character as is
                result.push_back(c);
            }
        }

        return result;
    }